

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O0

void __thiscall LongReadsDatastore::load_index(LongReadsDatastore *this,string *file)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  runtime_error *prVar5;
  ostream *poVar6;
  size_t sVar7;
  void *this_00;
  string *in_RSI;
  long in_RDI;
  SDG_FILETYPE type;
  sdgVersion_t version;
  sdgMagic_t magic;
  uint64_t fPos;
  uint64_t nReads;
  ifstream input_file;
  streamoff in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  ifstream *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  undefined8 local_330;
  undefined8 local_328;
  string local_2f8 [39];
  undefined1 local_2d1;
  string local_2b0 [39];
  undefined1 local_289;
  string local_288 [34];
  short local_266;
  ushort local_264;
  short local_262;
  undefined1 local_260 [8];
  undefined8 local_258;
  undefined1 local_249;
  string local_248 [48];
  long local_218 [65];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),in_RSI);
  pcVar3 = (char *)std::__cxx11::string::data();
  iVar2 = open(pcVar3,0);
  *(int *)(in_RDI + 8) = iVar2;
  std::ifstream::ifstream(local_218,local_10,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar6 = std::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6,": ");
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    std::operator<<(poVar6,pcVar3);
    local_249 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)prVar5,in_stack_fffffffffffffc90);
    std::runtime_error::runtime_error(prVar5,local_248);
    local_249 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_258 = 0;
  std::istream::read((char *)local_218,(long)&local_262);
  std::istream::read((char *)local_218,(long)&local_264);
  std::istream::read((char *)local_218,(long)&local_266);
  if (local_262 != 0x5d6) {
    local_289 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffc98,__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_288);
    local_289 = 0;
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_264 < 3) {
    local_2d1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    std::runtime_error::runtime_error(prVar5,local_2b0);
    local_2d1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_266 != 4) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    std::runtime_error::runtime_error(prVar5,local_2f8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read((char *)local_218,(long)&local_258);
  std::istream::read((char *)local_218,(long)local_260);
  sdglib::read_string(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::fpos<__mbstate_t>::fpos
            ((fpos<__mbstate_t> *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::istream::seekg(local_218,local_330,local_328);
  sdglib::read_flat_vector<ReadPosSize>
            (in_stack_fffffffffffffc60,
             (vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)in_stack_fffffffffffffc58);
  poVar6 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffc78 >> 0x18,0));
  poVar6 = std::operator<<(poVar6,"LongReadsDatastore open: ");
  poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0x28));
  poVar6 = std::operator<<(poVar6," Total reads: ");
  sVar7 = size((LongReadsDatastore *)0x3d3b64);
  this_00 = (void *)std::ostream::operator<<(poVar6,sVar7);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void LongReadsDatastore::load_index(std::string &file) {
    filename = file;
    fd = open(filename.data(), O_RDONLY);
    std::ifstream input_file(file, std::ios_base::binary);
    if (!input_file) {
        std::cerr << "Failed to open " << file <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + file);
    }
    uint64_t nReads(0);
    uint64_t fPos;

    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    input_file.read((char *) &magic, sizeof(magic));
    input_file.read((char *) &version, sizeof(version));
    input_file.read((char *) &type, sizeof(type));
    if (magic != SDG_MAGIC) {
        throw std::runtime_error("This file appears to be corrupted: " + file);
    }

    if (version < min_compat) {
        throw std::runtime_error("Incompatible version" + std::to_string(version));
    }

    if (type != LongDS_FT) {
        throw std::runtime_error("Incompatible file type" + std::to_string(type));
    }

    input_file.read((char*)&nReads, sizeof(nReads));

    input_file.read((char*)&fPos, sizeof(fPos));

    sdglib::read_string(input_file, name);

    input_file.seekg(fPos);
    sdglib::read_flat_vector(input_file, read_to_fileRecord);

    sdglib::OutputLog()<<"LongReadsDatastore open: "<<filename<<" Total reads: " <<size()<<std::endl;
}